

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llava.cpp
# Opt level: O2

bool llava_eval_image_embed
               (llama_context *ctx_llama,llava_image_embed *image_embed,int n_batch,int *n_past)

{
  int iVar1;
  int n_tokens;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  llava_embd_batch llava_batch;
  llava_embd_batch local_e0;
  
  uVar4 = llama_get_model();
  iVar2 = llama_model_n_embd(uVar4);
  lVar5 = (long)n_batch;
  lVar6 = -lVar5;
  lVar8 = 0;
  iVar7 = 0;
  do {
    iVar1 = image_embed->n_image_pos;
    lVar6 = lVar6 + lVar5;
    if (iVar1 <= lVar6) break;
    n_tokens = iVar7 + iVar1;
    if (n_batch <= iVar7 + iVar1) {
      n_tokens = n_batch;
    }
    llava_embd_batch::llava_embd_batch
              (&local_e0,(float *)((long)image_embed->embed + lVar8),n_tokens,*n_past,0);
    iVar3 = llama_decode(ctx_llama);
    if (iVar3 == 0) {
      *n_past = *n_past + n_tokens;
    }
    else {
      fprintf(_stderr,"%s : failed to eval\n","llava_eval_image_embed");
    }
    iVar7 = iVar7 - n_batch;
    lVar8 = lVar8 + iVar2 * lVar5 * 4;
    llava_embd_batch::~llava_embd_batch(&local_e0);
  } while (iVar3 == 0);
  return iVar1 <= lVar6;
}

Assistant:

bool llava_eval_image_embed(llama_context * ctx_llama, const struct llava_image_embed * image_embed, int n_batch, int * n_past) {
    int n_embd  = llama_model_n_embd(llama_get_model(ctx_llama));

    for (int i = 0; i < image_embed->n_image_pos; i += n_batch) {
        int n_eval = image_embed->n_image_pos - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        float * embd = image_embed->embed+i*n_embd;
        llava_embd_batch llava_batch = llava_embd_batch(embd, n_eval, *n_past, 0);
        if (llama_decode(ctx_llama, llava_batch.batch)) {
            LOG_ERR("%s : failed to eval\n", __func__);
            return false;
        }
        *n_past += n_eval;
    }
    return true;
}